

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O0

_Bool trans_fclass_s(DisasContext_conflict12 *ctx,arg_fclass_s *a)

{
  TCGContext_conflict11 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i64 retval;
  TCGv_i64 t0;
  TCGContext_conflict11 *tcg_ctx;
  arg_fclass_s *a_local;
  DisasContext_conflict12 *ctx_local;
  
  if (ctx->mstatus_fs == 0) {
    ctx_local._7_1_ = false;
  }
  else {
    _Var1 = has_ext(ctx,0x20);
    if (_Var1) {
      tcg_ctx_00 = ctx->uc->tcg_ctx;
      retval = tcg_temp_new_i64(tcg_ctx_00);
      gen_helper_fclass_s(tcg_ctx_00,retval,tcg_ctx_00->cpu_fpr[a->rs1]);
      gen_set_gpr(tcg_ctx_00,a->rd,retval);
      tcg_temp_free_i64(tcg_ctx_00,retval);
      ctx_local._7_1_ = true;
    }
    else {
      ctx_local._7_1_ = false;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

static bool trans_fclass_s(DisasContext *ctx, arg_fclass_s *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv t0 = tcg_temp_new(tcg_ctx);

    gen_helper_fclass_s(tcg_ctx, t0, tcg_ctx->cpu_fpr[a->rs1]);

    gen_set_gpr(tcg_ctx, a->rd, t0);
    tcg_temp_free(tcg_ctx, t0);

    return true;
}